

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O1

int32_t u_memcmp_63(UChar *buf1,UChar *buf2,int32_t count)

{
  UChar UVar1;
  UChar UVar2;
  int iVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  bool bVar6;
  
  if (0 < count) {
    bVar6 = true;
    iVar3 = (uint)(ushort)*buf1 - (uint)(ushort)*buf2;
    if (iVar3 == 0) {
      pUVar4 = buf2 + 1;
      pUVar5 = buf1 + 1;
      do {
        bVar6 = pUVar5 < buf1 + (uint)count;
        if (!bVar6) break;
        UVar1 = *pUVar5;
        UVar2 = *pUVar4;
        pUVar4 = pUVar4 + 1;
        pUVar5 = pUVar5 + 1;
        iVar3 = (uint)(ushort)UVar1 - (uint)(ushort)UVar2;
      } while (iVar3 == 0);
    }
    if (bVar6) {
      return iVar3;
    }
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_memcmp(const UChar *buf1, const UChar *buf2, int32_t count) {
    if(count > 0) {
        const UChar *limit = buf1 + count;
        int32_t result;

        while (buf1 < limit) {
            result = (int32_t)(uint16_t)*buf1 - (int32_t)(uint16_t)*buf2;
            if (result != 0) {
                return result;
            }
            buf1++;
            buf2++;
        }
    }
    return 0;
}